

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::joinLastTwoArcs(MyArc *arcs,int *noArcs)

{
  double dVar1;
  double local_2258;
  undefined1 local_2250 [8];
  AngleSet angles;
  double circleFitError;
  double r;
  double yc;
  double xc;
  undefined8 uStack_58;
  int noPixels;
  double endPointDiffThreshold;
  double d;
  double dy;
  double dx;
  double diff;
  double radiusDiffThreshold;
  double minR;
  int last;
  int prev;
  int *noArcs_local;
  MyArc *arcs_local;
  
  if (1 < *noArcs) {
    minR._4_4_ = *noArcs + -2;
    minR._0_4_ = *noArcs + -1;
    if ((((arcs[minR._4_4_].segmentNo == arcs[minR._0_4_].segmentNo) &&
         (arcs[minR._4_4_].turn == arcs[minR._0_4_].turn)) &&
        ((arcs[minR._4_4_].isEllipse & 1U) == 0)) && ((arcs[minR._0_4_].isEllipse & 1U) == 0)) {
      if (arcs[minR._4_4_].r < arcs[minR._0_4_].r || arcs[minR._4_4_].r == arcs[minR._0_4_].r) {
        local_2258 = arcs[minR._4_4_].r;
      }
      else {
        local_2258 = arcs[minR._0_4_].r;
      }
      radiusDiffThreshold = local_2258;
      diff = local_2258 * 0.25;
      dx = ABS(arcs[minR._4_4_].r - arcs[minR._0_4_].r);
      if (dx <= diff) {
        dy = (double)(arcs[minR._4_4_].ex - arcs[minR._0_4_].sx);
        d = (double)(arcs[minR._4_4_].ey - arcs[minR._0_4_].sy);
        _last = noArcs;
        noArcs_local = (int *)arcs;
        endPointDiffThreshold = sqrt(dy * dy + d * d);
        uStack_58 = 0x4024000000000000;
        if (endPointDiffThreshold <= 10.0) {
          xc._4_4_ = noArcs_local[(long)minR._4_4_ * 0x2a + 0x18] +
                     noArcs_local[(long)minR._0_4_ * 0x2a + 0x18];
          CircleFit(*(double **)(noArcs_local + (long)minR._4_4_ * 0x2a + 0x14),
                    *(double **)(noArcs_local + (long)minR._4_4_ * 0x2a + 0x16),xc._4_4_,&yc,&r,
                    &circleFitError,&angles.overlapAmount);
          if (angles.overlapAmount <= 1.5) {
            noArcs_local[(long)minR._4_4_ * 0x2a + 0x18] = xc._4_4_;
            *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 6) = angles.overlapAmount;
            *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a) = yc;
            *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 2) = r;
            *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 4) = circleFitError;
            noArcs_local[(long)minR._4_4_ * 0x2a + 0x12] =
                 noArcs_local[(long)minR._0_4_ * 0x2a + 0x12];
            noArcs_local[(long)minR._4_4_ * 0x2a + 0x13] =
                 noArcs_local[(long)minR._0_4_ * 0x2a + 0x13];
            AngleSet::AngleSet((AngleSet *)local_2250);
            AngleSet::set((AngleSet *)local_2250,
                          *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 8),
                          *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 10));
            AngleSet::set((AngleSet *)local_2250,
                          *(double *)(noArcs_local + (long)minR._0_4_ * 0x2a + 8),
                          *(double *)(noArcs_local + (long)minR._0_4_ * 0x2a + 10));
            AngleSet::computeStartEndTheta
                      ((AngleSet *)local_2250,(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 8)
                       ,(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 10));
            dVar1 = ArcLength(*(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 8),
                              *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 10));
            *(double *)(noArcs_local + (long)minR._4_4_ * 0x2a + 0xc) = dVar1 / 6.283185307179586;
            *_last = *_last + -1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void EDCircles::joinLastTwoArcs(MyArc *arcs, int &noArcs)
{
	if (noArcs < 2) return;

	int prev = noArcs - 2;
	int last = noArcs - 1;

	if (arcs[prev].segmentNo != arcs[last].segmentNo) return;
	if (arcs[prev].turn != arcs[last].turn) return;
	if (arcs[prev].isEllipse || arcs[last].isEllipse) return;

	// The radius difference between the arcs must be very small
	double minR = MIN(arcs[prev].r, arcs[last].r);
	double radiusDiffThreshold = minR*0.25;

	double diff = fabs(arcs[prev].r - arcs[last].r);
	if (diff > radiusDiffThreshold) return;

	// End-point distance
	double dx = arcs[prev].ex - arcs[last].sx;
	double dy = arcs[prev].ey - arcs[last].sy;
	double d = sqrt(dx*dx + dy*dy);

	double endPointDiffThreshold = 10;
	if (d > endPointDiffThreshold) return;

	// Try join
	int noPixels = arcs[prev].noPixels + arcs[last].noPixels;

	double xc, yc, r, circleFitError;
	CircleFit(arcs[prev].x, arcs[prev].y, noPixels, &xc, &yc, &r, &circleFitError);

	if (circleFitError <= LONG_ARC_ERROR) {
		arcs[prev].noPixels = noPixels;
		arcs[prev].circleFitError = circleFitError;

		arcs[prev].xc = xc;
		arcs[prev].yc = yc;
		arcs[prev].r = r;
		arcs[prev].ex = arcs[last].ex;
		arcs[prev].ey = arcs[last].ey;
		//    arcs[prev].eTheta = arcs[last].eTheta;   -- Fails in a very nasty way in a very special case (recall circles9 with cvsmooth(7x7)!) So, do not use.

		AngleSet angles;
		angles.set(arcs[prev].sTheta, arcs[prev].eTheta);
		angles.set(arcs[last].sTheta, arcs[last].eTheta);
		angles.computeStartEndTheta(arcs[prev].sTheta, arcs[prev].eTheta);

		//    arcs[prev].coverRatio = noPixels/(TWOPI*r);
		arcs[prev].coverRatio = ArcLength(arcs[prev].sTheta, arcs[prev].eTheta) / (TWOPI);

		noArcs--;
	} //end-if
}